

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocket.cpp
# Opt level: O3

PreparedMessage *
uWS::WebSocket<true>::prepareMessage
          (char *data,size_t length,OpCode opCode,bool compressed,
          _func_void_void_ptr_void_ptr_bool_void_ptr *callback)

{
  PreparedMessage *pPVar1;
  OpCode *pOVar2;
  long lVar3;
  
  pPVar1 = (PreparedMessage *)operator_new(0x20);
  pOVar2 = (OpCode *)operator_new__(length + 10);
  pPVar1->buffer = (char *)pOVar2;
  if (length < 0x7e) {
    pOVar2[1] = (OpCode)length;
    lVar3 = 2;
  }
  else if (length < 0x10000) {
    pOVar2[1] = 0x7e;
    *(ushort *)(pOVar2 + 2) = (ushort)length << 8 | (ushort)length >> 8;
    lVar3 = 4;
  }
  else {
    pOVar2[1] = 0x7f;
    *(size_t *)(pOVar2 + 2) =
         length >> 0x38 | (length & 0xff000000000000) >> 0x28 | (length & 0xff0000000000) >> 0x18 |
         (length & 0xff00000000) >> 8 | (length & 0xff000000) << 8 | (length & 0xff0000) << 0x18 |
         (length & 0xff00) << 0x28 | length << 0x38;
    lVar3 = 10;
  }
  *pOVar2 = compressed << 6 | opCode | 0x80;
  memcpy(pOVar2 + lVar3,data,length);
  pPVar1->length = lVar3 + length;
  pPVar1->references = 1;
  pPVar1->callback = callback;
  return pPVar1;
}

Assistant:

typename WebSocket<isServer>::PreparedMessage *WebSocket<isServer>::prepareMessage(char *data, size_t length, OpCode opCode, bool compressed, void(*callback)(void *webSocket, void *data, bool cancelled, void *reserved)) {
    PreparedMessage *preparedMessage = new PreparedMessage;
    preparedMessage->buffer = new char[length + 10];
    preparedMessage->length = WebSocketProtocol<isServer>::formatMessage(preparedMessage->buffer, data, length, opCode, length, compressed);
    preparedMessage->references = 1;
    preparedMessage->callback = callback;
    return preparedMessage;
}